

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

CCommandInfo * __thiscall
CConsole::GetCommandInfo(CConsole *this,char *pName,int FlagMask,bool Temp)

{
  int iVar1;
  
  do {
    this = (CConsole *)this->m_pFirstCommand;
    if (this == (CConsole *)0x0) {
      return (CCommandInfo *)0x0;
    }
  } while ((((*(uint *)&this->m_pFirstExec & FlagMask) == 0) ||
           (*(bool *)((long)&this->m_pFirstExec + 4) != Temp)) ||
          (iVar1 = str_comp_nocase(*(char **)&this->m_FlagMask,pName), iVar1 != 0));
  return (CCommandInfo *)this;
}

Assistant:

const IConsole::CCommandInfo *CConsole::GetCommandInfo(const char *pName, int FlagMask, bool Temp)
{
	for(CCommand *pCommand = m_pFirstCommand; pCommand; pCommand = pCommand->m_pNext)
	{
		if(pCommand->m_Flags&FlagMask && pCommand->m_Temp == Temp)
		{
			if(str_comp_nocase(pCommand->m_pName, pName) == 0)
				return pCommand;
		}
	}

	return 0;
}